

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3PagerSharedLock(Pager *pPager)

{
  Wal *pWal;
  sqlite3_vfs *psVar1;
  sqlite3_io_methods *psVar2;
  sqlite3_file *psVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  int f;
  int locked;
  int exists;
  Pgno nPage;
  uint local_50;
  uint local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  Pgno local_34;
  
  uVar5 = 0;
  if ((pPager->pWal == (Wal *)0x0) && (uVar5 = 0, pPager->eState == '\0')) {
    do {
      uVar5 = pagerLockDb(pPager,1);
      if (uVar5 != 5) {
        if (uVar5 != 0) {
          bVar4 = true;
          goto LAB_001505d3;
        }
        bVar7 = false;
        uVar5 = 0;
        if (pPager->eLock < 2) {
          psVar1 = pPager->pVfs;
          local_48 = CONCAT44(local_48._4_4_,1);
          psVar2 = pPager->jfd->pMethods;
          if (psVar2 == (sqlite3_io_methods *)0x0) {
            uVar5 = (*psVar1->xAccess)(psVar1,pPager->zJournal,0,(int *)&local_48);
          }
          bVar7 = true;
          if ((uVar5 == 0) && ((int)local_48 != 0)) {
            local_4c = 0;
            uVar5 = (*pPager->fd->pMethods->xCheckReservedLock)(pPager->fd,(int *)&local_4c);
            if (local_4c == 0 && uVar5 == 0) {
              uVar5 = pagerPagecount(pPager,&local_34);
              bVar7 = true;
              if (uVar5 == 0) {
                if ((psVar2 == (sqlite3_io_methods *)0x0) && (local_34 == 0)) {
                  if (sqlite3Hooks_0 != (code *)0x0) {
                    (*sqlite3Hooks_0)();
                  }
                  iVar6 = pagerLockDb(pPager,2);
                  if (iVar6 == 0) {
                    if (psVar1->xDelete != (_func_int_sqlite3_vfs_ptr_char_ptr_int *)0x0) {
                      (*psVar1->xDelete)(psVar1,pPager->zJournal,0);
                    }
                    if (pPager->exclusiveMode == '\0') {
                      pagerUnlockDb(pPager,1);
                    }
                  }
                  uVar5 = 0;
                  if (sqlite3Hooks_1 != (code *)0x0) {
                    (*sqlite3Hooks_1)();
                    uVar5 = 0;
                  }
                }
                else {
                  uVar5 = 0;
                  if (psVar2 == (sqlite3_io_methods *)0x0) {
                    local_50 = 0x801;
                    uVar5 = (*psVar1->xOpen)(psVar1,pPager->zJournal,pPager->jfd,0x801,
                                             (int *)&local_50);
                  }
                  if (uVar5 == 0xe) {
                    bVar7 = false;
                    uVar5 = 0;
                  }
                  else if (uVar5 == 0) {
                    local_50 = local_50 & 0xffffff00;
                    uVar5 = (*pPager->jfd->pMethods->xRead)(pPager->jfd,&local_50,1,0);
                    if (uVar5 == 0x20a) {
                      uVar5 = 0;
                    }
                    if (psVar2 == (sqlite3_io_methods *)0x0) {
                      psVar3 = pPager->jfd;
                      if (psVar3->pMethods != (sqlite3_io_methods *)0x0) {
                        (*psVar3->pMethods->xClose)(psVar3);
                        psVar3->pMethods = (sqlite3_io_methods *)0x0;
                      }
                    }
                    bVar7 = (char)local_50 == '\0';
                  }
                }
              }
            }
            else {
              bVar7 = true;
            }
          }
        }
        bVar4 = true;
        if (uVar5 != 0) goto LAB_001505d3;
        if (!bVar7) {
          uVar5 = 0x308;
          if ((pPager->readOnly != '\0') || (uVar5 = pagerLockDb(pPager,4), uVar5 != 0))
          goto LAB_001505d3;
          uVar5 = 0;
          if ((pPager->jfd->pMethods == (sqlite3_io_methods *)0x0) &&
             (pPager->journalMode != '\x02')) {
            psVar1 = pPager->pVfs;
            uVar5 = (*psVar1->xAccess)(psVar1,pPager->zJournal,0,(int *)&local_48);
            if ((uVar5 == 0) && ((int)local_48 != 0)) {
              local_4c = 0;
              uVar5 = (*psVar1->xOpen)(psVar1,pPager->zJournal,pPager->jfd,0x802,(int *)&local_4c);
              if ((uVar5 == 0) && (uVar5 = 0, (local_4c & 1) != 0)) {
                uVar5 = 0xe;
                sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xebfe,
                            "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
                psVar3 = pPager->jfd;
                if (psVar3->pMethods != (sqlite3_io_methods *)0x0) {
                  (*psVar3->pMethods->xClose)(psVar3);
                  psVar3->pMethods = (sqlite3_io_methods *)0x0;
                }
              }
            }
          }
          if (pPager->jfd->pMethods == (sqlite3_io_methods *)0x0) {
            if (pPager->exclusiveMode == '\0') {
              pagerUnlockDb(pPager,1);
            }
          }
          else {
            uVar5 = pagerSyncHotJournal(pPager);
            if (uVar5 == 0) {
              uVar5 = pager_playback(pPager,(uint)(pPager->tempFile == '\0'));
              pPager->eState = '\0';
            }
          }
          if (uVar5 != 0) {
            if (((char)uVar5 == '\r') || ((uVar5 & 0xff) == 10)) {
              pPager->errCode = uVar5;
              pPager->eState = '\x06';
              pPager->xGet = getPageError;
            }
            goto LAB_001505d3;
          }
        }
        if ((pPager->tempFile == '\0') && (pPager->hasHeldSharedLock != '\0')) {
          uVar5 = (*pPager->fd->pMethods->xRead)(pPager->fd,&local_48,0x10,0x18);
          bVar4 = false;
          if (uVar5 == 0) {
LAB_0015033d:
            auVar8[0] = -(pPager->dbFileVers[0] == (char)local_48);
            auVar8[1] = -(pPager->dbFileVers[1] == local_48._1_1_);
            auVar8[2] = -(pPager->dbFileVers[2] == local_48._2_1_);
            auVar8[3] = -(pPager->dbFileVers[3] == local_48._3_1_);
            auVar8[4] = -(pPager->dbFileVers[4] == local_48._4_1_);
            auVar8[5] = -(pPager->dbFileVers[5] == local_48._5_1_);
            auVar8[6] = -(pPager->dbFileVers[6] == local_48._6_1_);
            auVar8[7] = -(pPager->dbFileVers[7] == local_48._7_1_);
            auVar8[8] = -(pPager->dbFileVers[8] == (char)uStack_40);
            auVar8[9] = -(pPager->dbFileVers[9] == uStack_40._1_1_);
            auVar8[10] = -(pPager->dbFileVers[10] == uStack_40._2_1_);
            auVar8[0xb] = -(pPager->dbFileVers[0xb] == uStack_40._3_1_);
            auVar8[0xc] = -(pPager->dbFileVers[0xc] == uStack_40._4_1_);
            auVar8[0xd] = -(pPager->dbFileVers[0xd] == uStack_40._5_1_);
            auVar8[0xe] = -(pPager->dbFileVers[0xe] == uStack_40._6_1_);
            auVar8[0xf] = -(pPager->dbFileVers[0xf] == uStack_40._7_1_);
            bVar7 = true;
            if (((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                         (ushort)(auVar8[0xf] >> 7) << 0xf) != 0xffff) &&
               (pager_reset(pPager), pPager->bUseFetch != '\0')) {
              bVar4 = false;
              (*pPager->fd->pMethods->xUnfetch)(pPager->fd,0,(void *)0x0);
            }
          }
          else {
            if (uVar5 == 0x20a) {
              local_48 = 0;
              uStack_40 = 0;
              goto LAB_0015033d;
            }
            bVar4 = true;
            bVar7 = false;
          }
          if (!bVar7) goto LAB_001505d3;
        }
        uVar5 = pagerOpenWalIfPresent(pPager);
        bVar4 = false;
        goto LAB_001505d3;
      }
      iVar6 = (*pPager->xBusyHandler)(pPager->pBusyHandlerArg);
    } while (iVar6 != 0);
    bVar4 = true;
LAB_001505d3:
    if (bVar4) goto LAB_001505e4;
    if (bVar4) {
      return uVar5;
    }
  }
  if (pPager->pWal != (Wal *)0x0) {
    local_48 = local_48 & 0xffffffff00000000;
    sqlite3WalEndReadTransaction(pPager->pWal);
    pWal = pPager->pWal;
    iVar6 = 1;
    do {
      uVar5 = walTryBeginRead(pWal,(int *)&local_48,0,iVar6);
      iVar6 = iVar6 + 1;
    } while (uVar5 == 0xffffffff);
    if (((int)local_48 != 0 || uVar5 != 0) && (pager_reset(pPager), pPager->bUseFetch != '\0')) {
      (*pPager->fd->pMethods->xUnfetch)(pPager->fd,0,(void *)0x0);
    }
  }
  if (((pPager->tempFile == '\0') && (pPager->eState == '\0')) && (uVar5 == 0)) {
    uVar5 = pagerPagecount(pPager,&pPager->dbSize);
  }
LAB_001505e4:
  if (uVar5 == 0) {
    pPager->eState = '\x01';
    pPager->hasHeldSharedLock = '\x01';
  }
  else {
    pager_unlock(pPager);
  }
  return uVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerSharedLock(Pager *pPager){
  int rc = SQLITE_OK;                /* Return code */

  /* This routine is only called from b-tree and only when there are no
  ** outstanding pages. This implies that the pager state should either
  ** be OPEN or READER. READER is only possible if the pager is or was in
  ** exclusive access mode.  */
  assert( sqlite3PcacheRefCount(pPager->pPCache)==0 );
  assert( assert_pager_state(pPager) );
  assert( pPager->eState==PAGER_OPEN || pPager->eState==PAGER_READER );
  assert( pPager->errCode==SQLITE_OK );

  if( !pagerUseWal(pPager) && pPager->eState==PAGER_OPEN ){
    int bHotJournal = 1;          /* True if there exists a hot journal-file */

    assert( !MEMDB );
    assert( pPager->tempFile==0 || pPager->eLock==EXCLUSIVE_LOCK );

    rc = pager_wait_on_lock(pPager, SHARED_LOCK);
    if( rc!=SQLITE_OK ){
      assert( pPager->eLock==NO_LOCK || pPager->eLock==UNKNOWN_LOCK );
      goto failed;
    }

    /* If a journal file exists, and there is no RESERVED lock on the
    ** database file, then it either needs to be played back or deleted.
    */
    if( pPager->eLock<=SHARED_LOCK ){
      rc = hasHotJournal(pPager, &bHotJournal);
    }
    if( rc!=SQLITE_OK ){
      goto failed;
    }
    if( bHotJournal ){
      if( pPager->readOnly ){
        rc = SQLITE_READONLY_ROLLBACK;
        goto failed;
      }

      /* Get an EXCLUSIVE lock on the database file. At this point it is
      ** important that a RESERVED lock is not obtained on the way to the
      ** EXCLUSIVE lock. If it were, another process might open the
      ** database file, detect the RESERVED lock, and conclude that the
      ** database is safe to read while this process is still rolling the
      ** hot-journal back.
      **
      ** Because the intermediate RESERVED lock is not requested, any
      ** other process attempting to access the database file will get to
      ** this point in the code and fail to obtain its own EXCLUSIVE lock
      ** on the database file.
      **
      ** Unless the pager is in locking_mode=exclusive mode, the lock is
      ** downgraded to SHARED_LOCK before this function returns.
      */
      rc = pagerLockDb(pPager, EXCLUSIVE_LOCK);
      if( rc!=SQLITE_OK ){
        goto failed;
      }

      /* If it is not already open and the file exists on disk, open the
      ** journal for read/write access. Write access is required because
      ** in exclusive-access mode the file descriptor will be kept open
      ** and possibly used for a transaction later on. Also, write-access
      ** is usually required to finalize the journal in journal_mode=persist
      ** mode (and also for journal_mode=truncate on some systems).
      **
      ** If the journal does not exist, it usually means that some
      ** other connection managed to get in and roll it back before
      ** this connection obtained the exclusive lock above. Or, it
      ** may mean that the pager was in the error-state when this
      ** function was called and the journal file does not exist.
      */
      if( !isOpen(pPager->jfd) && pPager->journalMode!=PAGER_JOURNALMODE_OFF ){
        sqlite3_vfs * const pVfs = pPager->pVfs;
        int bExists;              /* True if journal file exists */
        rc = sqlite3OsAccess(
            pVfs, pPager->zJournal, SQLITE_ACCESS_EXISTS, &bExists);
        if( rc==SQLITE_OK && bExists ){
          int fout = 0;
          int f = SQLITE_OPEN_READWRITE|SQLITE_OPEN_MAIN_JOURNAL;
          assert( !pPager->tempFile );
          rc = sqlite3OsOpen(pVfs, pPager->zJournal, pPager->jfd, f, &fout);
          assert( rc!=SQLITE_OK || isOpen(pPager->jfd) );
          if( rc==SQLITE_OK && fout&SQLITE_OPEN_READONLY ){
            rc = SQLITE_CANTOPEN_BKPT;
            sqlite3OsClose(pPager->jfd);
          }
        }
      }

      /* Playback and delete the journal.  Drop the database write
      ** lock and reacquire the read lock. Purge the cache before
      ** playing back the hot-journal so that we don't end up with
      ** an inconsistent cache.  Sync the hot journal before playing
      ** it back since the process that crashed and left the hot journal
      ** probably did not sync it and we are required to always sync
      ** the journal before playing it back.
      */
      if( isOpen(pPager->jfd) ){
        assert( rc==SQLITE_OK );
        rc = pagerSyncHotJournal(pPager);
        if( rc==SQLITE_OK ){
          rc = pager_playback(pPager, !pPager->tempFile);
          pPager->eState = PAGER_OPEN;
        }
      }else if( !pPager->exclusiveMode ){
        pagerUnlockDb(pPager, SHARED_LOCK);
      }

      if( rc!=SQLITE_OK ){
        /* This branch is taken if an error occurs while trying to open
        ** or roll back a hot-journal while holding an EXCLUSIVE lock. The
        ** pager_unlock() routine will be called before returning to unlock
        ** the file. If the unlock attempt fails, then Pager.eLock must be
        ** set to UNKNOWN_LOCK (see the comment above the #define for
        ** UNKNOWN_LOCK above for an explanation).
        **
        ** In order to get pager_unlock() to do this, set Pager.eState to
        ** PAGER_ERROR now. This is not actually counted as a transition
        ** to ERROR state in the state diagram at the top of this file,
        ** since we know that the same call to pager_unlock() will very
        ** shortly transition the pager object to the OPEN state. Calling
        ** assert_pager_state() would fail now, as it should not be possible
        ** to be in ERROR state when there are zero outstanding page
        ** references.
        */
        pager_error(pPager, rc);
        goto failed;
      }

      assert( pPager->eState==PAGER_OPEN );
      assert( (pPager->eLock==SHARED_LOCK)
           || (pPager->exclusiveMode && pPager->eLock>SHARED_LOCK)
      );
    }

    if( !pPager->tempFile && pPager->hasHeldSharedLock ){
      /* The shared-lock has just been acquired then check to
      ** see if the database has been modified.  If the database has changed,
      ** flush the cache.  The hasHeldSharedLock flag prevents this from
      ** occurring on the very first access to a file, in order to save a
      ** single unnecessary sqlite3OsRead() call at the start-up.
      **
      ** Database changes are detected by looking at 15 bytes beginning
      ** at offset 24 into the file.  The first 4 of these 16 bytes are
      ** a 32-bit counter that is incremented with each change.  The
      ** other bytes change randomly with each file change when
      ** a codec is in use.
      **
      ** There is a vanishingly small chance that a change will not be
      ** detected.  The chance of an undetected change is so small that
      ** it can be neglected.
      */
      char dbFileVers[sizeof(pPager->dbFileVers)];

      IOTRACE(("CKVERS %p %d\n", pPager, sizeof(dbFileVers)));
      rc = sqlite3OsRead(pPager->fd, &dbFileVers, sizeof(dbFileVers), 24);
      if( rc!=SQLITE_OK ){
        if( rc!=SQLITE_IOERR_SHORT_READ ){
          goto failed;
        }
        memset(dbFileVers, 0, sizeof(dbFileVers));
      }

      if( memcmp(pPager->dbFileVers, dbFileVers, sizeof(dbFileVers))!=0 ){
        pager_reset(pPager);

        /* Unmap the database file. It is possible that external processes
        ** may have truncated the database file and then extended it back
        ** to its original size while this process was not holding a lock.
        ** In this case there may exist a Pager.pMap mapping that appears
        ** to be the right size but is not actually valid. Avoid this
        ** possibility by unmapping the db here. */
        if( USEFETCH(pPager) ){
          sqlite3OsUnfetch(pPager->fd, 0, 0);
        }
      }
    }

    /* If there is a WAL file in the file-system, open this database in WAL
    ** mode. Otherwise, the following function call is a no-op.
    */
    rc = pagerOpenWalIfPresent(pPager);
#ifndef SQLITE_OMIT_WAL
    assert( pPager->pWal==0 || rc==SQLITE_OK );
#endif
  }

  if( pagerUseWal(pPager) ){
    assert( rc==SQLITE_OK );
    rc = pagerBeginReadTransaction(pPager);
  }

  if( pPager->tempFile==0 && pPager->eState==PAGER_OPEN && rc==SQLITE_OK ){
    rc = pagerPagecount(pPager, &pPager->dbSize);
  }

 failed:
  if( rc!=SQLITE_OK ){
    assert( !MEMDB );
    pager_unlock(pPager);
    assert( pPager->eState==PAGER_OPEN );
  }else{
    pPager->eState = PAGER_READER;
    pPager->hasHeldSharedLock = 1;
  }
  return rc;
}